

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::_InternalParse(MapEntryImpl<CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                 *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  undefined1 auVar4 [12];
  bool bVar5;
  bool bVar6;
  string *s;
  Value *pVVar7;
  uint32_t res;
  uint uVar8;
  undefined8 *puVar9;
  byte *ptr_00;
  Arena *arena;
  byte *unaff_R13;
  pair<const_char_*,_unsigned_int> pVar10;
  pair<const_char_*,_int> pVar11;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  do {
    bVar5 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar5) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    auVar4[8] = bVar1;
    auVar4._0_8_ = local_38 + 1;
    auVar4._9_3_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_38[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar10 = ReadTagFallback((char *)local_38,res);
        auVar4 = pVar10._0_12_;
      }
      else {
        auVar4._8_4_ = res;
        auVar4._0_8_ = local_38 + 2;
      }
    }
    local_38 = auVar4._0_8_;
    if (local_38 == (byte *)0x0) {
      bVar5 = false;
      unaff_R13 = (byte *)0x0;
    }
    else {
      uVar8 = auVar4._8_4_;
      if (uVar8 == 0) {
LAB_00236684:
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
        bVar5 = false;
        unaff_R13 = local_38;
      }
      else {
        if (uVar8 == 0x12) {
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          arena = (Arena *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            arena = *(Arena **)arena;
          }
          if (this->value_ == (ValueOnMemory)0x0) {
            pVVar7 = Arena::CreateMaybeMessage<CoreML::Specification::MILSpec::Value>(arena);
            this->value_ = pVVar7;
          }
          local_38 = (byte *)ParseContext::ParseMessage
                                       (ctx,&this->value_->super_MessageLite,(char *)local_38);
        }
        else if (uVar8 == 10) {
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar9 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            puVar9 = (undefined8 *)*puVar9;
          }
          s = ArenaStringPtr::Mutable_abi_cxx11_(&this->key_,puVar9);
          bVar1 = *local_38;
          uVar8 = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            pVar11 = ReadSizeFallback((char *)local_38,(uint)bVar1);
            uVar8 = pVar11.second;
            ptr_00 = (byte *)pVar11.first;
          }
          else {
            ptr_00 = local_38 + 1;
          }
          if (ptr_00 == (byte *)0x0) {
            local_38 = (byte *)0x0;
          }
          else {
            local_38 = (byte *)EpsCopyInputStream::ReadString
                                         (&ctx->super_EpsCopyInputStream,(char *)ptr_00,uVar8,s);
          }
          bVar5 = false;
          bVar6 = WireFormatLite::VerifyUtf8String
                            ((s->_M_dataplus)._M_p,(int)s->_M_string_length,PARSE,
                             "CoreML.Specification.MILSpec.Program.AttributesEntry.key");
          if (!bVar6) {
            unaff_R13 = (byte *)0x0;
            goto LAB_002366ff;
          }
        }
        else {
          if ((uVar8 & 7) == 4) goto LAB_00236684;
          local_38 = (byte *)UnknownFieldParse(uVar8,(string *)0x0,(char *)local_38,ctx);
        }
        bVar5 = local_38 != (byte *)0x0;
        if (!bVar5) {
          unaff_R13 = (byte *)0x0;
        }
      }
    }
LAB_002366ff:
    if (!bVar5) {
      return (char *)unaff_R13;
    }
  } while( true );
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) final {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      if (tag == kKeyTag) {
        set_has_key();
        KeyMapEntryAccessorType* key = mutable_key();
        ptr = KeyTypeHandler::Read(ptr, ctx, key);
        if (!Derived::ValidateKey(key)) return nullptr;
      } else if (tag == kValueTag) {
        set_has_value();
        ValueMapEntryAccessorType* value = mutable_value();
        ptr = ValueTypeHandler::Read(ptr, ctx, value);
        if (!Derived::ValidateValue(value)) return nullptr;
      } else {
        if (tag == 0 || WireFormatLite::GetTagWireType(tag) ==
                            WireFormatLite::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        ptr = UnknownFieldParse(tag, static_cast<std::string*>(nullptr), ptr,
                                ctx);
      }
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
    return ptr;
  }